

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

void __thiscall test_argsort::initialize_tensors(test_argsort *this,ggml_context *ctx)

{
  float fVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  size_type __n;
  int iVar5;
  long lVar6;
  int i;
  long lVar7;
  vector<float,_std::allocator<float>_> data;
  default_random_engine rng;
  random_device rd;
  allocator_type local_13e9;
  _Vector_base<float,_std::allocator<float>_> local_13e8;
  test_argsort *local_13d0;
  ggml_context *local_13c8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c0;
  random_device local_13b8;
  
  local_13d0 = this;
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  iVar5 = (int)((uVar2 & 0xffffffff) % 0x7fffffff);
  local_13c0._M_x = (unsigned_long)(iVar5 + (uint)(iVar5 == 0));
  piVar3 = (int *)ggml_get_first_tensor(ctx);
  local_13c8 = ctx;
  do {
    if (piVar3 == (int *)0x0) {
      std::random_device::~random_device(&local_13b8);
      return;
    }
    if (*piVar3 == 0x1a) {
      __n = ggml_nelements(piVar3);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_13e8,__n,(allocator_type *)&local_13e9)
      ;
      lVar7 = 0;
      while( true ) {
        lVar4 = ggml_nelements(piVar3);
        if (lVar4 <= lVar7) break;
        fVar1 = (float)rand();
        local_13e8._M_impl.super__Vector_impl_data._M_start[lVar7] = fVar1;
        lVar7 = lVar7 + 1;
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_13e8._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_13e8._M_impl.super__Vector_impl_data._M_finish,&local_13c0);
      ggml_backend_tensor_set
                (piVar3,local_13e8._M_impl.super__Vector_impl_data._M_start,0,
                 (local_13d0->ne)._M_elems[0] * (local_13d0->ne)._M_elems[1] *
                 (local_13d0->ne)._M_elems[2] * (local_13d0->ne)._M_elems[3] * 4);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_13e8);
    }
    else {
      if (*piVar3 != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                   ,0xb30,"fatal error");
      }
      lVar7 = 0;
      while( true ) {
        lVar4 = ggml_nrows(piVar3);
        if (lVar4 <= lVar7) break;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_13e8,*(size_type *)(piVar3 + 4),
                   &local_13e9);
        lVar4 = *(long *)(piVar3 + 4);
        if (*(long *)(piVar3 + 4) < 1) {
          lVar4 = 0;
        }
        for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
          local_13e8._M_impl.super__Vector_impl_data._M_start[lVar6] = (float)(int)lVar6;
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   local_13e8._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   local_13e8._M_impl.super__Vector_impl_data._M_finish,&local_13c0);
        ggml_backend_tensor_set
                  (piVar3,local_13e8._M_impl.super__Vector_impl_data._M_start,
                   *(long *)(piVar3 + 0xe) * lVar7,*(long *)(piVar3 + 4) << 2);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_13e8);
        lVar7 = lVar7 + 1;
      }
    }
    piVar3 = (int *)ggml_get_next_tensor(local_13c8,piVar3);
  } while( true );
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        std::random_device rd;
        std::default_random_engine rng(rd());
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // indices
                std::vector<int> data(ggml_nelements(t));
                for (int i = 0; i < ggml_nelements(t); i++) {
                    data[i] = rand();
                }
                std::shuffle(data.begin(), data.end(), rng);
                ggml_backend_tensor_set(t, data.data(), 0, ne[0]*ne[1]*ne[2]*ne[3] * sizeof(int));
            } else if (t->type == GGML_TYPE_F32) {
                // initialize with unique values to avoid ties
                for (int64_t r = 0; r < ggml_nrows(t); r++) {
                    std::vector<float> data(t->ne[0]);
                    for (int i = 0; i < t->ne[0]; i++) {
                        data[i] = i;
                    }
                    std::shuffle(data.begin(), data.end(), rng);
                    ggml_backend_tensor_set(t, data.data(), r * t->nb[1], t->ne[0] * sizeof(float));
                }
            } else {
                GGML_ABORT("fatal error");
            }
        }
    }